

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,
          longdouble objective_amplifier)

{
  int k;
  rc_data *begin;
  long lVar1;
  bool bVar2;
  uint r_size;
  int selected;
  long lVar3;
  bool bVar4;
  undefined1 local_88 [20];
  longdouble local_74;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  pair<int,_int> *local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_68._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )((long)this + 0x10);
  bVar4 = false;
  local_3c = theta;
  local_48 = delta;
  local_54 = kappa;
  local_74 = objective_amplifier;
  local_60 = last._M_current;
  while( true ) {
    if (first._M_current == local_60) {
      return bVar4;
    }
    k = (first._M_current)->first;
    if (*(int *)(this + 0x78) <= k) break;
    sparse_matrix<int>::row
              ((sparse_matrix<int> *)local_88,
               (int)local_68._M_t.
                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                    _M_head_impl);
    solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,local_3c);
    r_size = solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                         *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,x);
    begin = *(rc_data **)(this + 0x58);
    lVar1 = *(long *)(this + 0x70);
    for (lVar3 = 0; (ulong)r_size << 5 != lVar3; lVar3 = lVar3 + 0x20) {
      *(longdouble *)((long)&begin->value + lVar3) =
           *(longdouble *)((long)&begin->value + lVar3) +
           *(longdouble *)(*(long *)(lVar1 + 8) + (long)*(int *)((long)&begin->id + lVar3) * 0x10) *
           local_74;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
              (begin,begin + (int)r_size,*(random_engine **)(this + 8));
    selected = solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
               ::select_variables((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                                   *)this,r_size,*(int *)(*(long *)(this + 0x60) + (long)k * 8),
                                  *(int *)(*(long *)(this + 0x60) + 4 + (long)k * 8));
    bVar2 = affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                        *)this,x,(row_value *)local_88._8_8_,k,selected,r_size,local_54,local_48);
    bVar4 = (bool)(bVar4 | bVar2);
    first._M_current = first._M_current + 1;
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                     ,"224");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }